

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

char * Extra_FileReadContents2(char *pFileName,char *pFileName2)

{
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar1;
  
  __stream = fopen(pFileName,"rb");
  __stream_00 = fopen(pFileName2,"rb");
  if (__stream_00 == (FILE *)0x0 || __stream == (FILE *)0x0) {
    pcVar1 = (char *)0x0;
    if (__stream == (FILE *)0x0) goto LAB_003cc4fa;
  }
  else {
    pcVar1 = Extra_FileRead2((FILE *)__stream,(FILE *)__stream_00);
  }
  fclose(__stream);
LAB_003cc4fa:
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  return pcVar1;
}

Assistant:

char * Extra_FileReadContents2( char * pFileName, char * pFileName2 )
{
    FILE * pFile, * pFile2;
    char * pBuffer;
    pFile  = fopen( pFileName, "rb" );
    pFile2 = fopen( pFileName2, "rb" );
    pBuffer = (pFile && pFile2) ? Extra_FileRead2( pFile, pFile2 ) : NULL;
    if ( pFile )  fclose( pFile );
    if ( pFile2 ) fclose( pFile2 );
    return pBuffer;
}